

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall
spatial_region::film
          (spatial_region *this,double x0,double x1,double ne_y0,double ne_y1,int ions,double cmr,
          double gradwidth,double y0,double y1,double z0,double z1,double T,double vx,
          bool is_profiled,int xnpic_film,int ynpic_film,int znpic_film,
          bool append_for_moving_window,double gradwidth_y)

{
  int iVar1;
  int in_ECX;
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double in_XMM1_Qa;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar13;
  undefined1 auVar12 [16];
  double in_XMM2_Qa;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double unaff_retaddr;
  int_vector3d *in_stack_00000008;
  int_vector3d *in_stack_00000010;
  double ux0;
  double tr_env;
  double tmp;
  int k;
  double nes;
  int j;
  int i;
  double film_ylen;
  int i1;
  int i0;
  int_vector3d b;
  int_vector3d a;
  int local_a4;
  int local_98;
  int local_94;
  int local_84;
  int local_80;
  int_vector3d local_7c;
  int_vector3d local_70;
  byte local_61;
  int local_60;
  int local_5c;
  int local_58;
  byte local_51;
  double local_50;
  double local_48;
  double local_40;
  int local_2c;
  int *ux0_00;
  
  local_51 = in_DL & 1;
  local_61 = tmp._0_1_ & 1;
  local_60 = in_R9D;
  local_5c = in_R8D;
  local_58 = in_ECX;
  local_50 = in_XMM7_Qa;
  local_48 = in_XMM6_Qa;
  local_40 = in_XMM5_Qa;
  local_2c = in_ESI;
  ux0_00 = in_RDI;
  int_vector3d::int_vector3d(&local_70);
  int_vector3d::int_vector3d(&local_7c);
  local_7c.i = local_58;
  local_7c.j = local_5c;
  local_7c.k = local_60;
  local_80 = (int)(in_XMM0_Qa / *(double *)(in_RDI + 4));
  iVar1 = (int)(in_XMM1_Qa / *(double *)(in_RDI + 4));
  if ((local_61 & 1) == 0) {
    if (local_80 < 0) {
      local_80 = 0;
    }
    local_84 = iVar1;
    if (iVar1 < 0) {
      local_84 = 0;
    }
    if (*in_RDI < local_80) {
      local_80 = *in_RDI;
    }
    if (*in_RDI < local_84) {
      local_84 = *in_RDI;
    }
  }
  else {
    local_80 = *in_RDI + -3;
    local_84 = local_80;
    if ((local_80 < *in_RDI + -2) && (*in_RDI + -2 <= iVar1)) {
      local_84 = *in_RDI + -2;
    }
  }
  for (local_94 = local_80; local_94 < local_84; local_94 = local_94 + 1) {
    local_98 = (int)(local_48 / *(double *)(in_RDI + 6));
    while (local_98 = local_98 + 1, local_98 < (int)(local_50 / *(double *)(in_RDI + 6)) + -1) {
      local_a4 = (int)((double)in_stack_00000008 / *(double *)(in_RDI + 8));
      while (local_a4 = local_a4 + 1,
            local_a4 < (int)((double)in_stack_00000010 / *(double *)(in_RDI + 8)) + -1) {
        if ((local_51 & 1) == 1) {
          auVar6._0_8_ = (double)local_98;
          auVar6._8_8_ = 0;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(in_RDI + 6);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = -(((double)in_RDI[1] * *(double *)(in_RDI + 6)) / 2.0);
          auVar3 = vfmadd213sd_fma(auVar3,auVar6,auVar14);
          dVar2 = auVar3._0_8_ / (((double)in_RDI[1] * *(double *)(in_RDI + 6)) / 2.0);
          cos(dVar2 * 1.5707963267948966 * dVar2 * dVar2 * dVar2 * dVar2);
          auVar7._0_8_ = (double)local_a4;
          auVar7._8_8_ = 0;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(in_RDI + 8);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = -(((double)in_RDI[2] * *(double *)(in_RDI + 8)) / 2.0);
          auVar3 = vfmadd213sd_fma(auVar4,auVar7,auVar15);
          dVar2 = auVar3._0_8_ / (((double)in_RDI[2] * *(double *)(in_RDI + 8)) / 2.0);
          cos(dVar2 * 1.5707963267948966 * dVar2 * dVar2 * dVar2 * dVar2);
        }
        local_70.i = local_94;
        local_70.j = local_98;
        local_70.k = local_a4;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = tr_env;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = -tr_env;
        auVar3 = vfmadd213sd_fma(auVar5,auVar8,ZEXT816(0x3ff0000000000000));
        sqrt(auVar3._0_8_);
        if (local_40 < 0.0) {
          if (local_94 < (int)((in_XMM0_Qa - local_40) / *(double *)(in_RDI + 4))) {
            auVar19._0_8_ = (double)local_94;
            auVar19._8_8_ = 0;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(in_RDI + 4);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = -in_XMM0_Qa;
            vfmadd213sd_fma(auVar11,auVar19,auVar26);
            uVar13 = 0;
            uVar22 = 0;
            fill_cell_by_particles
                      ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                       unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
            if (local_2c == 1) {
              auVar27._0_8_ = (double)local_94;
              auVar27._8_8_ = uVar22;
              auVar20._8_8_ = 0;
              auVar20._0_8_ = *(ulong *)(in_RDI + 4);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = -in_XMM0_Qa;
              vfmadd213sd_fma(auVar20,auVar27,auVar30);
              uVar13 = 0;
              fill_cell_by_particles
                        ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
            }
            if (local_2c == 2) {
              auVar21._0_8_ = (double)local_94;
              auVar21._8_8_ = uVar13;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *(ulong *)(in_RDI + 4);
              auVar28._8_8_ = 0;
              auVar28._0_8_ = -in_XMM0_Qa;
              vfmadd213sd_fma(auVar12,auVar21,auVar28);
              fill_cell_by_particles
                        ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
            }
          }
          else {
            fill_cell_by_particles
                      ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                       unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
            if (local_2c == 1) {
              fill_cell_by_particles
                        ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
            }
            if (local_2c == 2) {
              fill_cell_by_particles
                        ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
            }
          }
        }
        else if (local_94 < (int)((in_XMM0_Qa + local_40) / *(double *)(in_RDI + 4))) {
          auVar16._0_8_ = (double)local_94;
          auVar16._8_8_ = 0;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(in_RDI + 4);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = -in_XMM0_Qa;
          vfmadd213sd_fma(auVar9,auVar16,auVar23);
          uVar13 = 0;
          uVar22 = 0;
          fill_cell_by_particles
                    ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                     (double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
          if (local_2c == 1) {
            auVar24._0_8_ = (double)local_94;
            auVar24._8_8_ = uVar22;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = *(ulong *)(in_RDI + 4);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = -in_XMM0_Qa;
            vfmadd213sd_fma(auVar17,auVar24,auVar29);
            uVar13 = 0;
            fill_cell_by_particles
                      ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                       unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
          }
          if (local_2c == 2) {
            auVar18._0_8_ = (double)local_94;
            auVar18._8_8_ = uVar13;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(in_RDI + 4);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = -in_XMM0_Qa;
            vfmadd213sd_fma(auVar10,auVar18,auVar25);
            fill_cell_by_particles
                      ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                       unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
          }
        }
        else {
          fill_cell_by_particles
                    ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                     (double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
          if (local_2c == 1) {
            fill_cell_by_particles
                      ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                       unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
          }
          if (local_2c == 2) {
            fill_cell_by_particles
                      ((spatial_region *)tr_env,ux0,in_stack_00000010,in_stack_00000008,
                       unaff_retaddr,(double)ux0_00,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::film(double x0, double x1, double ne_y0, double ne_y1, int ions, double
        cmr, double gradwidth, double y0, double y1, double z0, double z1,
        double T, double vx, bool is_profiled,
        int xnpic_film, int ynpic_film, int znpic_film, bool append_for_moving_window, double gradwidth_y)
{ /* x0 - координата левой границы плёнки, x1 - правой, ne -
     концентрация электронов в плёнке, нормированная на критическую
     концентрацию */
    /* gradwidth - толщина части плёнки с линейным ростом плотности от
     * 0 на левой границе плёнки до ne при x0+gradwidth */
    /* при gradwidth<0 плотность плёнки линейно спадает от ne до 0 на
     * участке с градиентом */
    // if is_profiled == 1 then film has transverse envelope
    // ions == 0 - no ions, ions == 1 - use cmr, ions == 2 - positrons

    int_vector3d a,b;
    b.i = xnpic_film;
    b.j = ynpic_film;
    b.k = znpic_film;
    int i0,i1;
    i0 = x0/dx;
    i1 = x1/dx;

    if (append_for_moving_window)
    {
        i0 = nx-3;
        if (i0 < nx-2 && i1 >= nx-2)
        {
            i1 = nx-2;
        }
        else
        {
            i1 = i0; // the for loop is skipped
        }
    }
    else
    {
        if (i0<0) i0 = 0;
        if (i1<0) i1 = 0;
        if (i0>nx) i0 = nx;
        if (i1>nx) i1 = nx;
    }

    double film_ylen = double(int(y1/dy) - int(y0/dy) - 3);
    for(int i=i0;i<i1;i++)
    {
        for(int j=int(y0/dy)+1;j<int(y1/dy)-1;j++)
        {
            double nes = ne_y1 * (j - int(y0/dy) - 1) / film_ylen + ne_y0 * (int(y1/dy) - 2 - j) / film_ylen;
            for(int k=int(z0/dz)+1;k<int(z1/dz)-1;k++)
            {
                if (is_profiled == 1) {
                    double tmp = (j * dy - ny * dy / 2) / (ny * dy / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    double tr_env = tmp * tmp;
                    tmp =  (k * dz - nz * dz / 2) / (nz * dz / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    tr_env *= tmp * tmp;
                    nes *=  tr_env;
                }
                
                if (gradwidth_y >= 0 && j-int(y0/dy)-1 < gradwidth_y/dy) {
                    nes *= (j-int(y0/dy)-1) / (gradwidth_y/dy);
                }
                if (gradwidth_y >= 0 && int(y1/dy)-2-j < gradwidth_y/dy) {
                    nes *= (int(y1/dy)-2-j) / (gradwidth_y/dy);
                }
                //
                a.i = i;
                a.j = j;
                a.k = k;
                double ux0 = vx / sqrt(1 - vx * vx);
                if (gradwidth>=0) {
                    if (i>=int((x0+gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                    }
                } else {
                    if (i>=int((x0-gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                    }
                }
            }
        }
    }
}